

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

int Gia_QbfSolve(Gia_Man_t *pGia,int nPars,int nIterLimit,int nConfLimit,int nTimeOut,int nEncVars,
                int fGlucose,int fVerbose)

{
  Vec_Int_t *p;
  bmcg_sat_solver *s;
  long lVar1;
  int iVar2;
  int iVar3;
  Qbf_Man_t *p_00;
  ulong uVar4;
  Gia_Man_t *pCof;
  abctime aVar5;
  abctime aVar6;
  ulong uVar7;
  abctime time;
  abctime time_00;
  abctime extraout_RDX;
  abctime extraout_RDX_00;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  int local_70;
  
  uVar8 = (ulong)(uint)nIterLimit;
  p_00 = Gia_QbfAlloc(pGia,nPars,fGlucose,fVerbose);
  if (fVerbose != 0) {
    pcVar9 = pGia->pName;
    uVar10 = p_00->nPars;
    uVar11 = p_00->nVars;
    Gia_ManAndNum(pGia);
    printf("Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n",pcVar9,
           (ulong)uVar10,(ulong)uVar11);
  }
  if (pGia->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x34a,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  p = p_00->vValues;
  Vec_IntGrow(p,nPars);
  uVar4 = 0;
  uVar7 = 0;
  if (0 < nPars) {
    uVar7 = (ulong)(uint)nPars;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    p->pArray[uVar4] = 0;
  }
  p->nSize = nPars;
  uVar10 = 0;
  local_70 = -1;
  do {
    iVar2 = Gia_QbfVerify(p_00,p);
    uVar11 = p->nSize;
    if (iVar2 == 0) {
      uVar7 = 0;
      uVar4 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar4 = uVar7;
      }
      uVar11 = 0;
      for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        uVar11 = uVar11 + (p->pArray[uVar7] == 0);
      }
      local_70 = 0;
      printf("Parameters: ");
      if (p->nSize != nPars) {
        __assert_fail("Vec_IntSize(p->vValues) == nPars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x36c,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      Vec_IntPrintBinary(p);
      printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar11,(ulong)(p->nSize - uVar11));
      if (nEncVars != 0) {
        iVar3 = p->nSize / (1 << ((byte)nEncVars & 0x1f));
        if (p->nSize != iVar3 << ((byte)nEncVars & 0x1f)) {
          __assert_fail("Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                        ,0x372,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
        }
        Gia_Gen2CodePrint(nEncVars,iVar3,p);
      }
LAB_0061890f:
      if ((nTimeOut == 0 || iVar2 == 0) ||
         (aVar5 = Abc_Clock(), (aVar5 - p_00->clkStart) / 1000000 < (long)nTimeOut)) {
        if (nConfLimit == 0 || iVar2 == 0) {
          if (nIterLimit == 0 || iVar2 == 0) {
            pcVar9 = "The problem is SAT after %d iterations.  ";
            uVar8 = (ulong)uVar10;
          }
          else {
            pcVar9 = "The problem aborted after %d iterations.  ";
          }
        }
        else {
          pcVar9 = "The problem aborted after %d conflicts.  ";
          uVar8 = (ulong)(uint)nConfLimit;
        }
      }
      else {
        pcVar9 = "The problem timed out after %d sec.  ";
        uVar8 = (ulong)(uint)nTimeOut;
      }
      printf(pcVar9,uVar8);
LAB_0061899c:
      if (fVerbose == 0) {
        aVar5 = Abc_Clock();
        pcVar9 = (char *)(aVar5 - p_00->clkStart);
        iVar2 = 0x82525c;
        aVar5 = extraout_RDX_00;
      }
      else {
        putchar(10);
        pcVar9 = (char *)p_00->clkSat;
        Abc_PrintTime(0x83249b,pcVar9,time);
        aVar5 = Abc_Clock();
        lVar1 = p_00->clkStart;
        Abc_PrintTime(0x807e7e,(char *)(aVar5 - (long)(pcVar9 + lVar1)),time_00);
        aVar5 = Abc_Clock();
        pcVar9 = (char *)(aVar5 - lVar1);
        iVar2 = 0x7a9df1;
        aVar5 = extraout_RDX;
      }
      Abc_PrintTime(iVar2,pcVar9,aVar5);
      Gia_QbfFree(p_00);
      return local_70;
    }
    if (uVar11 != p_00->nVars) {
      __assert_fail("Vec_IntSize(p->vValues) == p->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x34f,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    pCof = Gia_QbfCofactor(pGia,nPars,p,p_00->vParMap);
    s = p_00->pSatSynG;
    if (s == (bmcg_sat_solver *)0x0) {
      iVar3 = Gia_QbfAddCofactor(p_00,pCof);
    }
    else {
      iVar3 = Gia_QbfAddCofactorG(p_00,pCof);
    }
    Gia_ManStop(pCof);
    if (iVar3 == 0) {
LAB_00618855:
      printf("The problem is UNSAT after %d iterations.  ",(ulong)uVar10);
      local_70 = 1;
      goto LAB_0061899c;
    }
    aVar5 = Abc_Clock();
    if (s == (bmcg_sat_solver *)0x0) {
      iVar3 = sat_solver_solve(p_00->pSatSyn,(lit *)0x0,(lit *)0x0,(long)nConfLimit,0,0,0);
    }
    else {
      iVar3 = bmcg_sat_solver_solve(s,(int *)0x0,0);
    }
    aVar6 = Abc_Clock();
    p_00->clkSat = p_00->clkSat + (aVar6 - aVar5);
    if (fVerbose != 0) {
      Gia_QbfPrint(p_00,p,uVar10);
    }
    if (iVar3 == -1) goto LAB_00618855;
    if (iVar3 == 0) goto LAB_0061890f;
    Gia_QbfOnePattern(p_00,p);
    if (p->nSize != p_00->nPars) {
      __assert_fail("Vec_IntSize(p->vValues) == p->nPars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x361,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    if ((nIterLimit != 0 && nIterLimit - 1U == uVar10) ||
       ((nTimeOut != 0 &&
        (aVar5 = Abc_Clock(), (long)nTimeOut <= (aVar5 - p_00->clkStart) / 1000000))))
    goto LAB_0061890f;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p = Gia_QbfAlloc( pGia, nPars, fGlucose, fVerbose );
    Gia_Man_t * pCof;
    int i, status, RetValue = 0;
    abctime clk;
//    Gia_QbfAddSpecialConstr( p );
    if ( fVerbose )
        printf( "Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n", 
            Gia_ManName(pGia), p->nPars, p->nVars, Gia_ManAndNum(pGia) );
    assert( Gia_ManRegNum(pGia) == 0 );
    Vec_IntFill( p->vValues, nPars, 0 );
    for ( i = 0; Gia_QbfVerify(p, p->vValues); i++ )
    {
        // generate next constraint
        assert( Vec_IntSize(p->vValues) == p->nVars );
        pCof = Gia_QbfCofactor( pGia, nPars, p->vValues, p->vParMap );
        status = p->pSatSynG ? Gia_QbfAddCofactorG( p, pCof ) : Gia_QbfAddCofactor( p, pCof );
        Gia_ManStop( pCof );
        if ( status == 0 )       { RetValue =  1; break; }
        // synthesize next assignment
        clk = Abc_Clock();
        if ( p->pSatSynG )
            status = bmcg_sat_solver_solve( p->pSatSynG, NULL, 0 );
        else
            status = sat_solver_solve( p->pSatSyn, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        p->clkSat += Abc_Clock() - clk;
        if ( fVerbose )
            Gia_QbfPrint( p, p->vValues, i );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue = -1; break; }
        // extract SAT assignment
        Gia_QbfOnePattern( p, p->vValues );
        assert( Vec_IntSize(p->vValues) == p->nPars );
        // examine variables
//        Gia_QbfLearnConstraint( p, p->vValues );
//        Vec_IntPrintBinary( p->vValues ); printf( "\n" );
        if ( nIterLimit && i+1 == nIterLimit ) { RetValue = -1; break; }
        if ( nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = -1; break; }
    }
    if ( RetValue == 0 )
    {
        int nZeros = Vec_IntCountZero( p->vValues );
        printf( "Parameters: " );
        assert( Vec_IntSize(p->vValues) == nPars );
        Vec_IntPrintBinary( p->vValues );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(p->vValues) - nZeros );
        if ( nEncVars )
        {
            int nBits = Vec_IntSize(p->vValues)/(1 << nEncVars);
            assert( Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits );
            Gia_Gen2CodePrint( nEncVars, nBits, p->vValues );
        }
    }
    if ( RetValue == -1 && nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "The problem timed out after %d sec.  ", nTimeOut );
    else if ( RetValue == -1 && nConfLimit )
        printf( "The problem aborted after %d conflicts.  ", nConfLimit );
    else if ( RetValue == -1 && nIterLimit )
        printf( "The problem aborted after %d iterations.  ", nIterLimit );
    else if ( RetValue == 1 )
        printf( "The problem is UNSAT after %d iterations.  ", i );
    else 
        printf( "The problem is SAT after %d iterations.  ", i );
    if ( fVerbose )
    {
        printf( "\n" );
        Abc_PrintTime( 1, "SAT  ", p->clkSat );
        Abc_PrintTime( 1, "Other", Abc_Clock() - p->clkStart - p->clkSat );
        Abc_PrintTime( 1, "TOTAL", Abc_Clock() - p->clkStart );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    Gia_QbfFree( p );
    return RetValue;
}